

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_image<unsigned_char,unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,CImg<unsigned_char> *sprite,
          CImg<unsigned_char> *mask,float opacity,float mask_max_value)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  CImgArgumentException *this_00;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  byte *pbVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  char *pcVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  float fVar34;
  float fVar35;
  ulong local_c0;
  CImg<unsigned_char> local_70 [2];
  
  puVar4 = this->_data;
  if (puVar4 != (uchar *)0x0) {
    uVar9 = this->_width;
    if (uVar9 != 0) {
      uVar13 = this->_height;
      if (uVar13 != 0) {
        uVar14 = this->_depth;
        if ((((uVar14 != 0) && (this->_spectrum != 0)) &&
            (puVar5 = sprite->_data, puVar5 != (uchar *)0x0)) &&
           (puVar6 = mask->_data, puVar6 != (uchar *)0x0)) {
          uVar25 = this->_spectrum;
          uVar15 = sprite->_width;
          uVar23 = sprite->_height;
          uVar31 = sprite->_depth;
          uVar21 = sprite->_spectrum;
          if ((puVar5 < puVar4 + (ulong)uVar14 * (ulong)uVar25 * (ulong)uVar13 * (ulong)uVar9) &&
             (puVar4 < puVar5 + (ulong)uVar31 * (ulong)uVar21 * (ulong)uVar23 * (ulong)uVar15)) {
            CImg(local_70,sprite,false);
            this = draw_image<unsigned_char,unsigned_char>
                             (this,x0,y0,z0,c0,local_70,mask,opacity,mask_max_value);
          }
          else {
            uVar32 = (ulong)mask->_spectrum * (ulong)mask->_depth *
                     (ulong)mask->_height * (ulong)mask->_width;
            if ((puVar4 + (ulong)uVar14 * (ulong)uVar25 * (ulong)uVar13 * (ulong)uVar9 <= puVar6) ||
               (puVar6 + uVar32 <= puVar4)) {
              if (((mask->_width != uVar15) || (mask->_height != uVar23)) ||
                 (mask->_depth != uVar31)) {
                this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
                pcVar26 = "non-";
                if (this->_is_shared != false) {
                  pcVar26 = "";
                }
                CImgArgumentException::CImgArgumentException
                          (this_00,
                           "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have incompatible dimensions."
                           ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                           (ulong)this->_spectrum,this->_data,pcVar26,"unsigned char",
                           (ulong)sprite->_width,(ulong)sprite->_height,(ulong)sprite->_depth,
                           (ulong)sprite->_spectrum,sprite->_data,(ulong)mask->_width,
                           (ulong)mask->_height,(ulong)mask->_depth,(ulong)mask->_spectrum,
                           mask->_data);
                __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
              }
              uVar27 = 0;
              if (0 < x0) {
                uVar27 = x0;
              }
              uVar20 = 0;
              if (0 < y0) {
                uVar20 = y0;
              }
              uVar12 = 0;
              if (0 < z0) {
                uVar12 = z0;
              }
              uVar30 = 0;
              if (0 < c0) {
                uVar30 = c0;
              }
              uVar28 = uVar27 - x0;
              iVar11 = uVar9 - (uVar15 + x0);
              if ((int)(uVar15 + x0) <= (int)uVar9) {
                iVar11 = 0;
              }
              iVar11 = iVar11 + (uVar15 - uVar28);
              iVar8 = uVar13 - (uVar23 + y0);
              if ((int)(uVar23 + y0) <= (int)uVar13) {
                iVar8 = 0;
              }
              iVar24 = uVar14 - (uVar31 + z0);
              if ((int)(uVar31 + z0) <= (int)uVar14) {
                iVar24 = 0;
              }
              iVar22 = uVar25 - (uVar21 + c0);
              if ((int)(uVar21 + c0) <= (int)uVar25) {
                iVar22 = 0;
              }
              if (iVar11 < 1) {
                return this;
              }
              uVar13 = uVar20 - y0;
              uVar9 = iVar8 + (uVar23 - uVar13);
              if ((int)uVar9 < 1) {
                return this;
              }
              uVar14 = uVar12 - z0;
              uVar25 = iVar24 + (uVar31 - uVar14);
              if ((int)uVar25 < 1) {
                return this;
              }
              uVar15 = uVar30 - c0;
              uVar23 = iVar22 + (uVar21 - uVar15);
              if ((int)uVar23 < 1) {
                return this;
              }
              local_c0 = (ulong)uVar30;
              uVar10 = 0;
              uVar31 = uVar15;
              do {
                uVar17 = 0;
                uVar19 = (ulong)uVar12;
                uVar21 = uVar14;
                do {
                  uVar18 = 0;
                  uVar29 = (ulong)uVar20;
                  uVar30 = uVar13;
                  do {
                    pbVar16 = mask->_data +
                              ((ulong)mask->_width *
                               ((long)(int)(uVar13 + (int)uVar18) +
                               (ulong)mask->_height *
                               ((ulong)mask->_depth * (long)(int)((int)uVar10 + uVar15) +
                               (long)(int)(uVar14 + (int)uVar17))) + (long)(int)uVar28) % uVar32;
                    uVar1 = sprite->_height;
                    uVar2 = sprite->_depth;
                    uVar3 = sprite->_width;
                    puVar4 = sprite->_data;
                    puVar5 = this->_data;
                    lVar7 = ((this->_depth * local_c0 + uVar19) * (ulong)this->_height + uVar29) *
                            (ulong)this->_width + (ulong)uVar27;
                    lVar33 = 0;
                    do {
                      fVar35 = (float)*pbVar16 * opacity;
                      fVar34 = 0.0;
                      if (0.0 <= fVar35) {
                        fVar34 = fVar35;
                      }
                      pbVar16 = pbVar16 + 1;
                      puVar5[lVar33 + lVar7] =
                           (uchar)(int)(((float)puVar4[lVar33 + (((ulong)uVar2 * (ulong)uVar31 +
                                                                 (ulong)uVar21) * (ulong)uVar1 +
                                                                (ulong)uVar30) * (ulong)uVar3 +
                                                                (ulong)uVar28] * ABS(fVar35) +
                                        (float)puVar5[lVar33 + lVar7] * (mask_max_value - fVar34)) /
                                       mask_max_value);
                      lVar33 = lVar33 + 1;
                    } while ((int)lVar33 < iVar11);
                    uVar18 = uVar18 + 1;
                    uVar30 = uVar30 + 1;
                    uVar29 = uVar29 + 1;
                  } while (uVar18 < uVar9);
                  uVar17 = uVar17 + 1;
                  uVar21 = uVar21 + 1;
                  uVar19 = uVar19 + 1;
                } while (uVar17 < uVar25);
                uVar10 = uVar10 + 1;
                uVar31 = uVar31 + 1;
                local_c0 = local_c0 + 1;
              } while (uVar10 < uVar23);
              return this;
            }
            CImg(local_70,mask,false);
            this = draw_image<unsigned_char,unsigned_char>
                             (this,x0,y0,z0,c0,sprite,local_70,opacity,mask_max_value);
          }
          if ((local_70[0]._is_shared == false) && (local_70[0]._data != (uchar *)0x0)) {
            operator_delete__(local_70[0]._data);
          }
        }
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<ti>& sprite, const CImg<tm>& mask, const float opacity=1,
                        const float mask_max_value=1) {
      if (is_empty() || !sprite || !mask) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,mask,opacity,mask_max_value);
      if (is_overlapped(mask)) return draw_image(x0,y0,z0,c0,sprite,+mask,opacity,mask_max_value);
      if (mask._width!=sprite._width || mask._height!=sprite._height || mask._depth!=sprite._depth)
        throw CImgArgumentException(_cimg_instance
                                    "draw_image(): Sprite (%u,%u,%u,%u,%p) and mask (%u,%u,%u,%u,%p) have "
                                    "incompatible dimensions.",
                                    cimg_instance,
                                    sprite._width,sprite._height,sprite._depth,sprite._spectrum,sprite._data,
                                    mask._width,mask._height,mask._depth,mask._spectrum,mask._data);

      const bool bx = x0<0, by = y0<0, bz = z0<0, bc = c0<0;
      const int
        dx0 = bx?0:x0, dy0 = by?0:y0, dz0 = bz?0:z0, dc0 = bc?0:c0,
        sx0 = dx0 - x0,  sy0 = dy0 - y0, sz0 = dz0 - z0, sc0 = dc0 - c0,
        lx = sprite.width() - sx0 - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0),
        ly = sprite.height() - sy0 - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0),
        lz = sprite.depth() - sz0 - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0),
        lc = sprite.spectrum() - sc0 - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0);
      const ulongT msize = mask.size();

      if (lx>0 && ly>0 && lz>0 && lc>0) {
        for (int c = 0; c<lc; ++c)
          for (int z = 0; z<lz; ++z)
            for (int y = 0; y<ly; ++y) {
              T *ptrd = data(dx0,dy0 + y,dz0 + z,dc0 + c);
              const ti *ptrs = sprite.data(sx0,sy0 + y,sz0 + z,sc0 + c);
              const tm *ptrm = mask._data + (mask.offset(sx0,sy0 + y,sz0 + z,sc0 + c)%msize);
              for (int x = 0; x<lx; ++x) {
                const float mopacity = (float)(*(ptrm++)*opacity),
                  nopacity = cimg::abs(mopacity), copacity = mask_max_value - std::max(mopacity,0.f);
                *ptrd = (T)((nopacity*(*(ptrs++)) + *ptrd*copacity)/mask_max_value);
                ++ptrd;
              }
            }
      }
      return *this;
    }